

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::OpenElement(XMLPrinter *this,char *name,bool compactMode)

{
  PrepareForNewNode(this,compactMode);
  DynArray<const_char_*,_10>::Push(&this->_stack,name);
  Write(this,"<");
  Write(this,name);
  this->_elementJustOpened = true;
  this->_depth = this->_depth + 1;
  return;
}

Assistant:

void XMLPrinter::OpenElement( const char* name, bool compactMode )
{
    PrepareForNewNode( compactMode );
    _stack.Push( name );

    Write ( "<" );
    Write ( name );

    _elementJustOpened = true;
    ++_depth;
}